

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::ViewportCallOrderCase::genProgram
          (ViewportCallOrderCase *this)

{
  Context *pCVar1;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> data;
  bool bVar2;
  ShaderProgram *this_00;
  RenderContext *renderCtx;
  Context *pCVar3;
  ProgramSources *pPVar4;
  TestLog *pTVar5;
  ShaderProgram *pSVar6;
  TestError *this_01;
  ShaderProgram *in_stack_fffffffffffffbf8;
  undefined8 in_stack_fffffffffffffc00;
  allocator<char> local_369;
  string local_368;
  allocator<char> local_341;
  string local_340;
  allocator<char> local_319;
  string local_318;
  LogSection local_2f8;
  DefaultDeleter<glu::ShaderProgram> local_2b2;
  undefined1 local_2b1;
  string local_2b0;
  string local_290;
  ShaderSource local_270;
  string local_248;
  string local_228;
  ShaderSource local_208;
  string local_1e0;
  string local_1c0;
  ShaderSource local_1a0;
  string local_178;
  string local_158;
  ShaderSource local_138;
  ProgramSources local_100;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> local_30;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *local_20;
  ViewportCallOrderCase *local_10;
  ViewportCallOrderCase *this_local;
  
  local_10 = this;
  this_00 = (ShaderProgram *)operator_new(0xd0);
  local_2b1 = 1;
  pSVar6 = this_00;
  renderCtx = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_100);
  pCVar1 = (this->super_TestCase).m_context;
  Functional::(anonymous_namespace)::ViewportCallOrderCase::genVertexSource_abi_cxx11_
            (&local_178,this);
  pCVar3 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_158,(_anonymous_namespace_ *)pCVar1,pCVar3,(char *)pSVar6);
  glu::VertexSource::VertexSource((VertexSource *)&local_138,&local_158);
  pPVar4 = glu::ProgramSources::operator<<(&local_100,&local_138);
  pCVar1 = (this->super_TestCase).m_context;
  Functional::(anonymous_namespace)::ViewportCallOrderCase::genFragmentSource_abi_cxx11_
            (&local_1e0,this);
  pCVar3 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_1c0,(_anonymous_namespace_ *)pCVar1,pCVar3,(char *)pSVar6);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_1a0,&local_1c0);
  pPVar4 = glu::ProgramSources::operator<<(pPVar4,&local_1a0);
  pCVar1 = (this->super_TestCase).m_context;
  Functional::(anonymous_namespace)::ViewportCallOrderCase::genTessellationControlSource_abi_cxx11_
            (&local_248,this);
  pCVar3 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_228,(_anonymous_namespace_ *)pCVar1,pCVar3,(char *)pSVar6);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)&local_208,&local_228);
  pPVar4 = glu::ProgramSources::operator<<(pPVar4,&local_208);
  pCVar1 = (this->super_TestCase).m_context;
  Functional::(anonymous_namespace)::ViewportCallOrderCase::
  genTessellationEvaluationSource_abi_cxx11_(&local_2b0,this);
  pCVar3 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_290,(_anonymous_namespace_ *)pCVar1,pCVar3,(char *)pSVar6);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_270,&local_290);
  pPVar4 = glu::ProgramSources::operator<<(pPVar4,&local_270);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,pPVar4);
  local_2b1 = 0;
  de::DefaultDeleter<glu::ShaderProgram>::DefaultDeleter(&local_2b2);
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::MovePtr
            ((MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)&local_30);
  local_20 = de::details::MovePtr::operator_cast_to_PtrData(&local_30,(MovePtr *)this_00);
  data._8_8_ = in_stack_fffffffffffffc00;
  data.ptr = in_stack_fffffffffffffbf8;
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::operator=
            (&this->m_program,data);
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::~MovePtr
            ((MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)&local_30);
  glu::TessellationEvaluationSource::~TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  glu::TessellationControlSource::~TessellationControlSource
            ((TessellationControlSource *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  glu::VertexSource::~VertexSource((VertexSource *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  glu::ProgramSources::~ProgramSources(&local_100);
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"Program",&local_319);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_340,"Shader program",&local_341);
  tcu::LogSection::LogSection(&local_2f8,&local_318,&local_340);
  pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_2f8);
  pSVar6 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
           operator*(&(this->m_program).
                      super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>)
  ;
  pTVar5 = glu::operator<<(pTVar5,pSVar6);
  tcu::TestLog::operator<<(pTVar5,(EndSectionToken *)&tcu::TestLog::EndSection);
  tcu::LogSection::~LogSection(&local_2f8);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator(&local_341);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator(&local_319);
  pSVar6 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
           operator->(&(this->m_program).
                       super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                     );
  bVar2 = glu::ShaderProgram::isOk(pSVar6);
  if (!bVar2) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,"shader build failed",&local_369);
    tcu::TestError::TestError(this_01,&local_368);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void ViewportCallOrderCase::genProgram (void)
{
	m_program = de::MovePtr<glu::ShaderProgram>(new glu::ShaderProgram(m_context.getRenderContext(),
																	   glu::ProgramSources()
																			<< glu::VertexSource(specializeShader(m_context, genVertexSource().c_str()))
																			<< glu::FragmentSource(specializeShader(m_context, genFragmentSource().c_str()))
																			<< glu::TessellationControlSource(specializeShader(m_context, genTessellationControlSource().c_str()))
																			<< glu::TessellationEvaluationSource(specializeShader(m_context, genTessellationEvaluationSource().c_str()))));

	m_testCtx.getLog()
		<< tcu::TestLog::Section("Program", "Shader program")
		<< *m_program
		<< tcu::TestLog::EndSection;

	if (!m_program->isOk())
		throw tcu::TestError("shader build failed");
}